

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O3

void __thiscall
TPZSparseBlockDiagonal<float>::Gather
          (TPZSparseBlockDiagonal<float> *this,TPZFMatrix<float> *in,TPZFMatrix<float> *out)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined4 extraout_XMM0_Da;
  
  lVar1 = (in->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  if (0 < lVar1) {
    lVar2 = (this->fBlock).fNElements;
    lVar4 = 0;
    lVar5 = 0;
    do {
      if (0 < lVar2) {
        lVar6 = 0;
        do {
          (*(in->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
          )(in,(this->fBlock).fStore[lVar6],lVar5);
          lVar3 = (out->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
          if ((lVar3 <= lVar6) || ((out->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol <= lVar5))
          {
            TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          *(undefined4 *)((long)out->fElem + lVar6 * 4 + lVar3 * lVar4) = extraout_XMM0_Da;
          lVar6 = lVar6 + 1;
        } while (lVar2 != lVar6);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 4;
    } while (lVar5 != lVar1);
  }
  return;
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::Gather(const TPZFMatrix<TVar> &in, TPZFMatrix<TVar> &out) const
{
    int64_t neq = fBlock.NElements();
    int64_t nc = in.Cols();
    int64_t ieq,ic;
    for(ic=0; ic<nc; ic++)
    {
		for(ieq=0; ieq<neq; ieq++) out(ieq,ic) = in.GetVal(fBlock[ieq],ic);
    }
}